

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureWrapClampToBorderCase::
TextureWrapClampToBorderCase
          (TextureWrapClampToBorderCase *this,TestContext *testCtx,RenderContext *renderCtx,
          char *name,char *desc,GLenum target,TesterType tester,QueryType type)

{
  GLenum GVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,desc);
  (this->super_TextureTest).m_renderCtx = renderCtx;
  (this->super_TextureTest).m_target = target;
  GVar1 = mapTesterToPname(tester);
  (this->super_TextureTest).m_pname = GVar1;
  (this->super_TextureTest).m_tester = tester;
  (this->super_TextureTest).m_type = type;
  (this->super_TextureTest).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00b4e6b8;
  return;
}

Assistant:

TextureWrapClampToBorderCase::TextureWrapClampToBorderCase (tcu::TestContext& testCtx, const glu::RenderContext& renderCtx, const char* name, const char* desc, glw::GLenum target, TesterType tester, QueryType type)
	: TextureTest(testCtx, renderCtx, name, desc, target, tester, type)
{
}